

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O2

void __thiscall CommandLineParser::~CommandLineParser(CommandLineParser *this)

{
  this->_vptr_CommandLineParser = (_func_int **)&PTR__CommandLineParser_0010bd18;
  std::__cxx11::string::~string((string *)&this->m_option);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&this->m_arguments);
  std::deque<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>::~deque
            (&this->m_plugIns);
  std::__cxx11::string::~string((string *)&this->m_testPath);
  std::__cxx11::string::~string((string *)&this->m_encoding);
  std::__cxx11::string::~string((string *)&this->m_xsl);
  std::__cxx11::string::~string((string *)&this->m_xmlFileName);
  return;
}

Assistant:

CommandLineParser::~CommandLineParser()
{
}